

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O1

void __thiscall cmCTestBuildHandler::GenerateXMLHeader(cmCTestBuildHandler *this,cmXMLWriter *xml)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_58;
  string local_38;
  
  cmCTest::StartXML((this->super_cmCTestGenericHandler).CTest,xml,
                    (this->super_cmCTestGenericHandler).AppendXML);
  paVar1 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Build","");
  cmXMLWriter::StartElement(xml,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"StartDateTime","");
  cmXMLWriter::StartElement(xml,&local_58);
  cmXMLWriter::Content<std::__cxx11::string>(xml,&this->StartBuild);
  cmXMLWriter::EndElement(xml);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"StartBuildTime","");
  local_38._M_dataplus._M_p._0_4_ = (undefined4)(long)this->StartBuildTime;
  cmXMLWriter::Element<unsigned_int>(xml,&local_58,(uint *)&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"BuildCommand","");
  GetMakeCommand_abi_cxx11_(&local_38,this);
  cmXMLWriter::StartElement(xml,&local_58);
  cmXMLWriter::Content<std::__cxx11::string>(xml,&local_38);
  cmXMLWriter::EndElement(xml);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_38._M_dataplus._M_p._4_4_,local_38._M_dataplus._M_p._0_4_) !=
      &local_38.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_38._M_dataplus._M_p._4_4_,local_38._M_dataplus._M_p._0_4_),
                    local_38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmCTestBuildHandler::GenerateXMLHeader(cmXMLWriter& xml)
{
  this->CTest->StartXML(xml, this->AppendXML);
  xml.StartElement("Build");
  xml.Element("StartDateTime", this->StartBuild);
  xml.Element("StartBuildTime",
    static_cast<unsigned int>(this->StartBuildTime));
  xml.Element("BuildCommand", this->GetMakeCommand());
}